

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

void __thiscall QHttpThreadDelegate::synchronousFinishedSlot(QHttpThreadDelegate *this)

{
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> tVar3;
  qsizetype qVar4;
  QHttpThreadDelegate QVar5;
  int iVar6;
  NetworkError NVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QString local_b0;
  undefined1 local_98 [32];
  QString local_78;
  type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QHttpNetworkReply **)(this + 0x150) != (QHttpNetworkReply *)0x0) {
    iVar6 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    if (399 < iVar6) {
      QVar8.m_data = (storage_type *)0x2a;
      QVar8.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar8);
      local_78.d.d = local_58.d.d;
      local_78.d.ptr = local_58.d.ptr;
      local_78.d.size = local_58.d.size;
      QHttpNetworkRequest::url((QHttpNetworkRequest *)local_98);
      QUrl::toString((QString *)(local_98 + 8),(QHttpNetworkRequest *)local_98,0);
      QHttpNetworkReply::reasonPhrase(&local_b0,*(QHttpNetworkReply **)(this + 0x150));
      QString::arg<QString,QString>(&local_58,&local_78,(QString *)(local_98 + 8),&local_b0);
      pQVar2 = *(QArrayData **)(this + 0xf8);
      tVar3.ptr = *(QHttpNetworkRequestPrivate **)(this + 0x100);
      *(Data **)(this + 0xf8) = local_58.d.d;
      *(char16_t **)(this + 0x100) = local_58.d.ptr;
      qVar4 = *(qsizetype *)(this + 0x108);
      *(qsizetype *)(this + 0x108) = local_58.d.size;
      local_58.d.d = (Data *)pQVar2;
      local_58.d.ptr = (char16_t *)tVar3.ptr;
      local_58.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QHttpNetworkRequestPrivate *)local_98._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
        LOCK();
        *(int *)local_98._8_8_ = *(int *)local_98._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_98._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_98._8_8_,2,0x10);
        }
      }
      QUrl::~QUrl((QUrl *)local_98);
      iVar6 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
      QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_58);
      NVar7 = statusCodeFromHttp(iVar6,(QUrl *)&local_58);
      *(NetworkError *)(this + 0xf0) = NVar7;
      QUrl::~QUrl((QUrl *)&local_58);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QVar5 = (QHttpThreadDelegate)
            QHttpNetworkReply::isCompressed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xda] = QVar5;
    QHttpNetworkReply::readAll((QByteArray *)&local_58,*(QHttpNetworkReply **)(this + 0x150));
    pQVar2 = *(QArrayData **)(this + 0x98);
    tVar3.ptr = *(QHttpNetworkRequestPrivate **)(this + 0xa0);
    *(Data **)(this + 0x98) = local_58.d.d;
    *(char16_t **)(this + 0xa0) = local_58.d.ptr;
    qVar4 = *(qsizetype *)(this + 0xa8);
    *(qsizetype *)(this + 0xa8) = local_58.d.size;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_58.d.d = (Data *)pQVar2;
        local_58.d.ptr = (char16_t *)tVar3.ptr;
        local_58.d.size = qVar4;
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
    pqVar1 = &local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x150),"deleteLater",QueuedConnection,1,(void **)&local_58,
               (char **)&local_58.d.ptr,(QMetaTypeInterface **)pqVar1);
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x158),"quit",QueuedConnection,1,(void **)&local_58,
               (char **)&local_58.d.ptr,(QMetaTypeInterface **)pqVar1);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif
    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            incomingErrorDetail = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            incomingErrorCode = statusCodeFromHttp(httpReply->statusCode(), httpRequest.url());
    }

    isCompressed = httpReply->isCompressed();
    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}